

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall GB::jr_cc_n(GB *this,u8 mask,u8 val)

{
  u16 *puVar1;
  long lVar2;
  u8 uVar3;
  
  lVar2 = (this->s).op_tick;
  if (lVar2 != 0x16) {
    if (lVar2 != 0xe) {
      return;
    }
    uVar3 = read_n(this);
    (this->s).field_6.field_0.z = uVar3;
    if ((mask & (this->s).field_2.field_0.f) == val) {
      puVar1 = &(this->s).pc;
      *puVar1 = *puVar1 + (short)(char)uVar3;
      return;
    }
  }
  (this->s).op_tick = -2;
  return;
}

Assistant:

void GB::jr_cc_n(u8 mask, u8 val) {
  switch (s.op_tick) {
    case 14:
      s.z = read_n();
      if (f_is(mask, val)) {
        s.pc += (s8)s.z;
      }
      break;
    case 22: op_done(); break;
  }
}